

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void int_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                 JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  undefined1 uVar2;
  uint uVar3;
  JSAMPARRAY ppJVar4;
  undefined8 *in_RCX;
  undefined1 *puVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int outrow;
  int inrow;
  int v_expand;
  int h_expand;
  JSAMPROW outend;
  int h;
  JSAMPLE invalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY output_data;
  my_upsample_ptr upsample;
  int local_60;
  int local_5c;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  JSAMPARRAY output_array;
  undefined1 *puVar6;
  JSAMPARRAY input_array;
  
  input_array = (JSAMPARRAY)*in_RCX;
  bVar1 = *(byte *)(*(long *)(in_RDI + 0x260) + 0xe8 + (long)*(int *)(in_RSI + 4));
  uVar3 = (uint)*(byte *)(*(long *)(in_RDI + 0x260) + 0xf2 + (long)*(int *)(in_RSI + 4));
  local_5c = 0;
  for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x19c); local_60 = uVar3 + local_60) {
    output_array = (JSAMPARRAY)input_array[local_60];
    ppJVar4 = (JSAMPARRAY)((long)output_array + (ulong)*(uint *)(in_RDI + 0x88));
    puVar6 = *(undefined1 **)(in_RDX + (long)local_5c * 8);
    while (output_array < ppJVar4) {
      puVar5 = puVar6 + 1;
      uVar2 = *puVar6;
      in_stack_ffffffffffffffbc = CONCAT13(uVar2,(int3)in_stack_ffffffffffffffbc);
      for (in_stack_ffffffffffffffb8 = (uint)bVar1; puVar6 = puVar5,
          0 < (int)in_stack_ffffffffffffffb8;
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 - 1) {
        *(undefined1 *)output_array = uVar2;
        output_array = (JSAMPARRAY)((long)output_array + 1);
      }
    }
    if (1 < uVar3) {
      jcopy_sample_rows(input_array,(int)((ulong)puVar6 >> 0x20),output_array,
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                        (JDIMENSION)((ulong)ppJVar4 >> 0x20));
    }
    local_5c = local_5c + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
             JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  register int h;
  JSAMPROW outend;
  int h_expand, v_expand;
  int inrow, outrow;

  h_expand = upsample->h_expand[compptr->component_index];
  v_expand = upsample->v_expand[compptr->component_index];

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    /* Generate one output row with proper horizontal expansion */
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      for (h = h_expand; h > 0; h--) {
        *outptr++ = invalue;
      }
    }
    /* Generate any additional output rows by duplicating the first one */
    if (v_expand > 1) {
      jcopy_sample_rows(output_data, outrow, output_data, outrow + 1,
                        v_expand - 1, cinfo->output_width);
    }
    inrow++;
    outrow += v_expand;
  }
}